

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_copy_image_section(fitsfile *fptr,fitsfile *newptr,char *expr,int *status)

{
  char cVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  double *array;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long *plVar15;
  uint uVar16;
  long *plVar17;
  fitsfile *pfVar18;
  long lVar19;
  double dVar20;
  int naxis;
  int *local_318;
  int anynull;
  fitsfile *local_308;
  fitsfile *local_300;
  long local_2f8;
  int tstatus;
  int bitpix;
  double cdelt;
  long local_2e0;
  LONGLONG local_2d8;
  double local_2d0;
  long smax;
  long smin;
  int numkeys;
  long local_2b0;
  long incs [9];
  long local_258 [10];
  long lpixels [9];
  char *cptr;
  long sinc;
  long naxes [9];
  char keyname [75];
  long outnaxes [9];
  char card [81];
  
  plVar15 = &DAT_00206190;
  plVar17 = naxes;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *plVar17 = *plVar15;
    plVar15 = plVar15 + 1;
    plVar17 = plVar17 + 1;
  }
  plVar15 = &DAT_00206190;
  plVar17 = local_258;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *plVar17 = *plVar15;
    plVar15 = plVar15 + 1;
    plVar17 = plVar17 + 1;
  }
  plVar15 = &DAT_00206190;
  plVar17 = lpixels;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *plVar17 = *plVar15;
    plVar15 = plVar15 + 1;
    plVar17 = plVar17 + 1;
  }
  plVar15 = &DAT_00206190;
  plVar17 = incs;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *plVar17 = *plVar15;
    plVar15 = plVar15 + 1;
    plVar17 = plVar17 + 1;
  }
  if (0 < *status) {
    return *status;
  }
  ffgidt(fptr,&bitpix,status);
  ffgidm(fptr,&naxis,status);
  iVar6 = ffgisz(fptr,naxis,naxes,status);
  if (iVar6 < 1) {
    if (naxis - 5U < 0xfffffffc) {
      pfVar18 = (fitsfile *)"Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions";
LAB_0012e50c:
      ffpmsg((char *)pfVar18);
      *status = 0xd4;
      return 0xd4;
    }
    local_308 = (fitsfile *)expr;
    ffcrim(newptr,bitpix,naxis,naxes,status);
    ffghsp(fptr,&numkeys,(int *)0x0,status);
    if (3 < numkeys) {
      iVar6 = 3;
      do {
        iVar6 = iVar6 + 1;
        ffgrec(fptr,iVar6,card,status);
        iVar7 = ffgkcl(card);
        if (0x14 < iVar7) {
          ffprec(newptr,card,status);
        }
      } while (iVar6 < numkeys);
    }
    if (*status < 1) {
      cptr = (char *)local_308;
      local_318 = status;
      local_300 = fptr;
      if (0 < naxis) {
        lVar13 = 0;
        do {
          iVar6 = fits_get_section_range(&cptr,&smin,&smax,&sinc,status);
          if (0 < iVar6) {
            ffpmsg("error parsing the following image section specifier:");
            pfVar18 = local_308;
            goto LAB_0012e5b1;
          }
          if (smax == 0) {
            smax = naxes[lVar13];
          }
          else if (smin == 0) {
            smin = naxes[lVar13];
          }
          if ((naxes[lVar13] < smin) || (naxes[lVar13] < smax)) {
            ffpmsg("image section exceeds dimensions of input image:");
            pfVar18 = local_308;
            goto LAB_0012e50c;
          }
          local_258[lVar13] = smin;
          lpixels[lVar13] = smax;
          local_2d8 = sinc;
          lVar10 = smin - smax;
          if (smin - smax == 0 || smin < smax) {
            lVar10 = -(smin - smax);
          }
          incs[lVar13] = sinc;
          local_2d8 = (lVar10 + local_2d8) / local_2d8;
          outnaxes[lVar13] = local_2d8;
          local_2f8 = lVar13 + 1;
          ffkeyn("NAXIS",(int)local_2f8,keyname,status);
          ffmkyj(newptr,keyname,local_2d8,(char *)0x0,status);
          if ((local_258[lVar13] != 1) || (incs[lVar13] != 1)) {
            iVar6 = -1;
            do {
              ffkeyn("CRPIX",(int)local_2f8,keyname,status);
              cVar1 = (char)iVar6;
              if (iVar6 != -1) {
                sVar9 = strlen(keyname);
                keyname[(int)sVar9] = cVar1 + 'A';
                keyname[(long)((sVar9 << 0x20) + 0x100000000) >> 0x20] = '\0';
              }
              tstatus = 0;
              iVar7 = ffgky(local_300,0x52,keyname,&local_2d0,(char *)0x0,&tstatus);
              if (iVar7 == 0) {
                dVar20 = (double)local_258[lVar13];
                if (lpixels[lVar13] < local_258[lVar13]) {
                  dVar20 = dVar20 - local_2d0;
                }
                else {
                  dVar20 = local_2d0 - dVar20;
                }
                local_2d0 = dVar20 / (double)incs[lVar13] + 1.0;
                ffmkyd(newptr,keyname,local_2d0,0xf,(char *)0x0,local_318);
                piVar2 = local_318;
                if ((incs[lVar13] != 1) || (lpixels[lVar13] < local_258[lVar13])) {
                  ffkeyn("CDELT",(int)local_2f8,keyname,local_318);
                  if (iVar6 != -1) {
                    sVar9 = strlen(keyname);
                    keyname[(int)sVar9] = cVar1 + 'A';
                    keyname[(long)((sVar9 << 0x20) + 0x100000000) >> 0x20] = '\0';
                  }
                  tstatus = 0;
                  iVar7 = ffgky(local_300,0x52,keyname,&cdelt,(char *)0x0,&tstatus);
                  if (iVar7 == 0) {
                    lVar10 = -incs[lVar13];
                    if (local_258[lVar13] <= lpixels[lVar13]) {
                      lVar10 = incs[lVar13];
                    }
                    cdelt = (double)lVar10 * cdelt;
                    ffmkyd(newptr,keyname,cdelt,0xf,(char *)0x0,piVar2);
                  }
                  ffkeyn("CD1_",(int)local_2f8,keyname,piVar2);
                  if (iVar6 != -1) {
                    sVar9 = strlen(keyname);
                    keyname[(int)sVar9] = cVar1 + 'A';
                    keyname[(long)((sVar9 << 0x20) + 0x100000000) >> 0x20] = '\0';
                  }
                  iVar7 = -9;
                  do {
                    keyname[2] = (char)iVar7 + ':';
                    tstatus = 0;
                    iVar8 = ffgky(local_300,0x52,keyname,&cdelt,(char *)0x0,&tstatus);
                    if (iVar8 == 0) {
                      lVar10 = incs[lVar13];
                      if (lpixels[lVar13] < local_258[lVar13]) {
                        lVar10 = -lVar10;
                      }
                      cdelt = (double)lVar10 * cdelt;
                      ffmkyd(newptr,keyname,cdelt,0xf,(char *)0x0,local_318);
                    }
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != 0);
                }
              }
              iVar6 = iVar6 + 1;
              status = local_318;
            } while (iVar6 != 0x1a);
          }
          lVar13 = local_2f8;
        } while (local_2f8 < naxis);
      }
      iVar6 = ffrdef(newptr,status);
      pfVar18 = local_300;
      if (0 < iVar6) goto LAB_0012e4f5;
      ffpscl(local_300,1.0,0.0,status);
      ffpscl(newptr,1.0,0.0,status);
      uVar16 = -bitpix;
      if (0 < bitpix) {
        uVar16 = bitpix;
      }
      array = (double *)malloc((ulong)(uVar16 >> 3) * outnaxes[0]);
      lVar5 = lpixels[3];
      lVar4 = lpixels[2];
      lVar3 = local_258[3];
      lVar10 = local_258[2];
      lVar13 = local_258[1];
      if (array == (double *)0x0) {
        ffpmsg("fits_copy_image_section: no memory for image section");
        *status = 0x71;
        return 0x71;
      }
      lVar11 = local_258[3] - lpixels[3];
      if (local_258[3] - lpixels[3] == 0 || local_258[3] < lpixels[3]) {
        lVar11 = -(local_258[3] - lpixels[3]);
      }
      lVar19 = local_258[2] - lpixels[2];
      if (local_258[2] - lpixels[2] == 0 || local_258[2] < lpixels[2]) {
        lVar19 = -(local_258[2] - lpixels[2]);
      }
      local_2d8 = lpixels[1];
      lVar12 = local_258[1] - lpixels[1];
      if (local_258[1] - lpixels[1] == 0 || local_258[1] < lpixels[1]) {
        lVar12 = -(local_258[1] - lpixels[1]);
      }
      local_2f8 = (lVar12 + incs[1]) / incs[1];
      local_2b0 = (lVar19 + incs[2]) / incs[2];
      lVar11 = (lVar11 + incs[3]) / incs[3];
      local_308 = newptr;
      if (0 < lVar11) {
        lVar19 = 1;
        local_2e0 = 0;
        do {
          if (lVar5 < lVar3) {
            local_258[3] = -(incs[3] * local_2e0);
          }
          else {
            local_258[3] = incs[3] * local_2e0;
          }
          local_258[3] = lVar3 + local_258[3];
          lpixels[3] = local_258[3];
          if (0 < local_2b0) {
            lVar12 = 0;
            do {
              if (lVar4 < lVar10) {
                local_258[2] = -(incs[2] * lVar12);
              }
              else {
                local_258[2] = incs[2] * lVar12;
              }
              local_258[2] = lVar10 + local_258[2];
              lpixels[2] = local_258[2];
              if (0 < local_2f8) {
                lVar14 = 0;
                do {
                  piVar2 = local_318;
                  if (local_2d8 < lVar13) {
                    local_258[1] = -(incs[1] * lVar14);
                  }
                  else {
                    local_258[1] = incs[1] * lVar14;
                  }
                  local_258[1] = lVar13 + local_258[1];
                  lpixels[1] = local_258[1];
                  if (bitpix < 0x10) {
                    if (bitpix == -0x40) {
                      ffgsvd(pfVar18,1,naxis,naxes,local_258,lpixels,incs,-9.1191291391491e-36,array
                             ,&anynull,local_318);
                      pfVar18 = local_300;
                      ffppnd(local_308,1,lVar19,outnaxes[0],array,-9.1191291391491e-36,piVar2);
                    }
                    else if (bitpix == -0x20) {
                      ffgsve(pfVar18,1,naxis,naxes,local_258,lpixels,incs,-9.11912e-36,
                             (float *)array,&anynull,local_318);
                      pfVar18 = local_300;
                      ffppne(local_308,1,lVar19,outnaxes[0],(float *)array,-9.11912e-36,piVar2);
                    }
                    else if (bitpix == 8) {
                      ffgsvb(pfVar18,1,naxis,naxes,local_258,lpixels,incs,'\0',(uchar *)array,
                             &anynull,local_318);
                      pfVar18 = local_300;
                      ffpprb(local_308,1,lVar19,outnaxes[0],(uchar *)array,piVar2);
                    }
                  }
                  else if (bitpix == 0x10) {
                    ffgsvi(pfVar18,1,naxis,naxes,local_258,lpixels,incs,0,(short *)array,&anynull,
                           local_318);
                    pfVar18 = local_300;
                    ffppri(local_308,1,lVar19,outnaxes[0],(short *)array,piVar2);
                  }
                  else if (bitpix == 0x20) {
                    ffgsvk(pfVar18,1,naxis,naxes,local_258,lpixels,incs,0,(int *)array,&anynull,
                           local_318);
                    pfVar18 = local_300;
                    ffpprk(local_308,1,lVar19,outnaxes[0],(int *)array,piVar2);
                  }
                  else if (bitpix == 0x40) {
                    ffgsvjj(pfVar18,1,naxis,naxes,local_258,lpixels,incs,0,(LONGLONG *)array,
                            &anynull,local_318);
                    pfVar18 = local_300;
                    ffpprjj(local_308,1,lVar19,outnaxes[0],(LONGLONG *)array,piVar2);
                  }
                  lVar19 = lVar19 + outnaxes[0];
                  lVar14 = lVar14 + 1;
                } while (local_2f8 != lVar14);
              }
              lVar12 = lVar12 + 1;
              status = local_318;
            } while (lVar12 != local_2b0);
          }
          local_2e0 = local_2e0 + 1;
        } while (local_2e0 != lVar11);
      }
      free(array);
      if (*status < 1) {
        return *status;
      }
      pfVar18 = (fitsfile *)"fits_copy_image_section: error copying image section";
    }
    else {
      pfVar18 = (fitsfile *)"error copying header from input image to output image";
    }
LAB_0012e5b1:
    ffpmsg((char *)pfVar18);
  }
LAB_0012e4f5:
  return *status;
}

Assistant:

int fits_copy_image_section(
           fitsfile *fptr,  /* I - pointer to input image */
           fitsfile *newptr,  /* I - pointer to output image */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output HDU
  */

    int bitpix, naxis, numkeys, nkey;
    long naxes[] = {1,1,1,1,1,1,1,1,1}, smin, smax, sinc;
    long fpixels[] = {1,1,1,1,1,1,1,1,1};
    long lpixels[] = {1,1,1,1,1,1,1,1,1};
    long incs[] = {1,1,1,1,1,1,1,1,1};
    char *cptr, keyname[FLEN_KEYWORD], card[FLEN_CARD];
    int ii, tstatus, anynull;
    long minrow, maxrow, minslice, maxslice, mincube, maxcube;
    long firstpix;
    long ncubeiter, nsliceiter, nrowiter, kiter, jiter, iiter;
    int klen, kk, jj;
    long outnaxes[9], outsize, buffsize;
    double *buffer, crpix, cdelt;

    if (*status > 0)
        return(*status);

    /* get the size of the input image */
    fits_get_img_type(fptr, &bitpix, status);
    fits_get_img_dim(fptr, &naxis, status);
    if (fits_get_img_size(fptr, naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > 4)
    {
        ffpmsg(
        "Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions");
        return(*status = BAD_NAXIS);
    }

    /* create output image with same size and type as the input image */
    /*  Will update the size later */
    fits_create_img(newptr, bitpix, naxis, naxes, status);

    /* copy all other non-structural keywords from the input to output file */
    fits_get_hdrspace(fptr, &numkeys, NULL, status);

    for (nkey = 4; nkey <= numkeys; nkey++) /* skip the first few keywords */
    {
        fits_read_record(fptr, nkey, card, status);

        if (fits_get_keyclass(card) > TYP_CMPRS_KEY)
        {
            /* write the record to the output file */
            fits_write_record(newptr, card, status);
        }
    }

    if (*status > 0)
    {
         ffpmsg("error copying header from input image to output image");
         return(*status);
    }

    /* parse the section specifier to get min, max, and inc for each axis */
    /* and the size of each output image axis */

    cptr = expr;
    for (ii=0; ii < naxis; ii++)
    {
       if (fits_get_section_range(&cptr, &smin, &smax, &sinc, status) > 0)
       {
          ffpmsg("error parsing the following image section specifier:");
          ffpmsg(expr);
          return(*status);
       }

       if (smax == 0)
          smax = naxes[ii];   /* use whole axis  by default */
       else if (smin == 0)
          smin = naxes[ii];   /* use inverted whole axis */

       if (smin > naxes[ii] || smax > naxes[ii])
       {
          ffpmsg("image section exceeds dimensions of input image:");
          ffpmsg(expr);
          return(*status = BAD_NAXIS);
       }

       fpixels[ii] = smin;
       lpixels[ii] = smax;
       incs[ii] = sinc;

       if (smin <= smax)
           outnaxes[ii] = (smax - smin + sinc) / sinc;
       else
           outnaxes[ii] = (smin - smax + sinc) / sinc;

       /* modify the NAXISn keyword */
       fits_make_keyn("NAXIS", ii + 1, keyname, status);
       fits_modify_key_lng(newptr, keyname, outnaxes[ii], NULL, status);

       /* modify the WCS keywords if necessary */

       if (fpixels[ii] != 1 || incs[ii] != 1)
       {
            for (kk=-1;kk<26; kk++)  /* modify any alternate WCS keywords */
	{
         /* read the CRPIXn keyword if it exists in the input file */
         fits_make_keyn("CRPIX", ii + 1, keyname, status);
	 
         if (kk != -1) {
	   klen = strlen(keyname);
	   keyname[klen]='A' + kk;
	   keyname[klen + 1] = '\0';
	 }

         tstatus = 0;
         if (fits_read_key(fptr, TDOUBLE, keyname, 
             &crpix, NULL, &tstatus) == 0)
         {
           /* calculate the new CRPIXn value */
           if (fpixels[ii] <= lpixels[ii]) {
             crpix = (crpix - (fpixels[ii])) / incs[ii] + 1.0;
              /*  crpix = (crpix - (fpixels[ii] - 1.0) - .5) / incs[ii] + 0.5; */
           } else {
             crpix = (fpixels[ii] - crpix)  / incs[ii] + 1.0;
             /* crpix = (fpixels[ii] - (crpix - 1.0) - .5) / incs[ii] + 0.5; */
           }

           /* modify the value in the output file */
           fits_modify_key_dbl(newptr, keyname, crpix, 15, NULL, status);

           if (incs[ii] != 1 || fpixels[ii] > lpixels[ii])
           {
             /* read the CDELTn keyword if it exists in the input file */
             fits_make_keyn("CDELT", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             tstatus = 0;
             if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
             {
               /* calculate the new CDELTn value */
               if (fpixels[ii] <= lpixels[ii])
                 cdelt = cdelt * incs[ii];
               else
                 cdelt = cdelt * (-incs[ii]);
              
               /* modify the value in the output file */
               fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
             }

             /* modify the CDi_j keywords if they exist in the input file */

             fits_make_keyn("CD1_", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             for (jj=0; jj < 9; jj++)   /* look for up to 9 dimensions */
	     {
	       keyname[2] = '1' + jj;
	       
               tstatus = 0;
               if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
               {
                 /* calculate the new CDi_j value */
                 if (fpixels[ii] <= lpixels[ii])
                   cdelt = cdelt * incs[ii];
                 else
                   cdelt = cdelt * (-incs[ii]);
              
                 /* modify the value in the output file */
                 fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
               }
	     }
	     
           } /* end of if (incs[ii]... loop */
         }   /* end of fits_read_key loop */
	}    /* end of for (kk  loop */
       }
    }  /* end of main NAXIS loop */

    if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
    {
        return(*status);
    }

    /* turn off any scaling of the pixel values */
    fits_set_bscale(fptr,  1.0, 0.0, status);
    fits_set_bscale(newptr, 1.0, 0.0, status);

    /* to reduce memory foot print, just read/write image 1 row at a time */

    outsize = outnaxes[0];
    buffsize = (abs(bitpix) / 8) * outsize;

    buffer = (double *) malloc(buffsize); /* allocate memory for the image row */
    if (!buffer)
    {
        ffpmsg("fits_copy_image_section: no memory for image section");
        return(*status = MEMORY_ALLOCATION);
    }

    /* read the image section then write it to the output file */

    minrow = fpixels[1];
    maxrow = lpixels[1];
    if (minrow > maxrow) {
        nrowiter = (minrow - maxrow + incs[1]) / incs[1];
    } else {
        nrowiter = (maxrow - minrow + incs[1]) / incs[1];
    }

    minslice = fpixels[2];
    maxslice = lpixels[2];
    if (minslice > maxslice) {
        nsliceiter = (minslice - maxslice + incs[2]) / incs[2];
    } else {
        nsliceiter = (maxslice - minslice + incs[2]) / incs[2];
    }

    mincube = fpixels[3];
    maxcube = lpixels[3];
    if (mincube > maxcube) {
        ncubeiter = (mincube - maxcube + incs[3]) / incs[3];
    } else {
        ncubeiter = (maxcube - mincube + incs[3]) / incs[3];
    }

    firstpix = 1;
    for (kiter = 0; kiter < ncubeiter; kiter++)
    {
      if (mincube > maxcube) {
	 fpixels[3] = mincube - (kiter * incs[3]);
      } else {
	 fpixels[3] = mincube + (kiter * incs[3]);
      }
      
      lpixels[3] = fpixels[3];

      for (jiter = 0; jiter < nsliceiter; jiter++)
      {
        if (minslice > maxslice) {
	    fpixels[2] = minslice - (jiter * incs[2]);
        } else {
	    fpixels[2] = minslice + (jiter * incs[2]);
        }

	lpixels[2] = fpixels[2];

        for (iiter = 0; iiter < nrowiter; iiter++)
        {
            if (minrow > maxrow) {
	       fpixels[1] = minrow - (iiter * incs[1]);
	    } else {
	       fpixels[1] = minrow + (iiter * incs[1]);
            }

	    lpixels[1] = fpixels[1];

	    if (bitpix == 8)
	    {
	        ffgsvb(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (unsigned char *) buffer, &anynull, status);

	        ffpprb(newptr, 1, firstpix, outsize, (unsigned char *) buffer, status);
	    }
	    else if (bitpix == 16)
	    {
	        ffgsvi(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (short *) buffer, &anynull, status);

	        ffppri(newptr, 1, firstpix, outsize, (short *) buffer, status);
	    }
	    else if (bitpix == 32)
	    {
	        ffgsvk(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (int *) buffer, &anynull, status);

	        ffpprk(newptr, 1, firstpix, outsize, (int *) buffer, status);
	    }
	    else if (bitpix == -32)
	    {
	        ffgsve(fptr, 1, naxis, naxes, fpixels, lpixels, incs, FLOATNULLVALUE,
	            (float *) buffer, &anynull, status);

	        ffppne(newptr, 1, firstpix, outsize, (float *) buffer, FLOATNULLVALUE, status);
	    }
	    else if (bitpix == -64)
	    {
	        ffgsvd(fptr, 1, naxis, naxes, fpixels, lpixels, incs, DOUBLENULLVALUE,
	             buffer, &anynull, status);

	        ffppnd(newptr, 1, firstpix, outsize, buffer, DOUBLENULLVALUE,
	               status);
	    }
	    else if (bitpix == 64)
	    {
	        ffgsvjj(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (LONGLONG *) buffer, &anynull, status);

	        ffpprjj(newptr, 1, firstpix, outsize, (LONGLONG *) buffer, status);
	    }

            firstpix += outsize;
        }
      }
    }

    free(buffer);  /* finished with the memory */

    if (*status > 0)
    {
        ffpmsg("fits_copy_image_section: error copying image section");
        return(*status);
    }

    return(*status);
}